

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void __thiscall Abs<0,_0>::Abs(Abs<0,_0> *this,IntView<0> _x,IntView<0> _y)

{
  IntVar *pIVar1;
  
  pIVar1 = _x.var;
  Propagator::Propagator(&this->super_Propagator);
  Checker::Checker(&this->super_Checker);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_001f24a0;
  (this->super_Checker)._vptr_Checker = (_func_int **)&DAT_001f2508;
  (this->x).var = pIVar1;
  (this->x).a = (int)_x._8_8_;
  (this->x).b = (int)((ulong)_x._8_8_ >> 0x20);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->super_Propagator).priority = 1;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,0,6);
  pIVar1 = (this->y).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,1,4);
  return;
}

Assistant:

Abs(IntView<U> _x, IntView<V> _y) : x(_x), y(_y) {
		priority = 1;
		x.attach(this, 0, EVENT_LU);
		y.attach(this, 1, EVENT_U);
	}